

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O0

void __thiscall polyscope::SlicePlane::~SlicePlane(SlicePlane *this)

{
  bool bVar1;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  this_00;
  const_iterator in_RDI;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  pos;
  string *in_stack_00000108;
  Engine *in_stack_00000110;
  vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>
  *in_stack_ffffffffffffff68;
  iterator in_stack_ffffffffffffff70;
  undefined1 *__val;
  __normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
  in_stack_ffffffffffffff80;
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_> *this_01;
  string local_28 [24];
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_> *in_stack_fffffffffffffff0;
  
  this_01 = render::engine;
  std::__cxx11::string::string(local_28,(string *)(in_RDI._M_current + 4));
  render::Engine::removeSlicePlane(in_stack_00000110,in_stack_00000108);
  std::__cxx11::string::~string(local_28);
  __val = polyscope::state::slicePlanes;
  std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::begin
            (in_stack_ffffffffffffff68);
  std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::end
            (in_stack_ffffffffffffff68);
  this_00 = std::
            find<__gnu_cxx::__normal_iterator<polyscope::SlicePlane**,std::vector<polyscope::SlicePlane*,std::allocator<polyscope::SlicePlane*>>>,polyscope::SlicePlane*>
                      (in_RDI._M_current,in_stack_ffffffffffffff80,(SlicePlane **)__val);
  std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::end
            (in_stack_ffffffffffffff68);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                      *)in_stack_ffffffffffffff70._M_current,
                     (__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                      *)in_stack_ffffffffffffff68);
  if (!bVar1) {
    __gnu_cxx::
    __normal_iterator<polyscope::SlicePlane*const*,std::vector<polyscope::SlicePlane*,std::allocator<polyscope::SlicePlane*>>>
    ::__normal_iterator<polyscope::SlicePlane**>
              ((__normal_iterator<polyscope::SlicePlane_*const_*,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                *)in_stack_ffffffffffffff70._M_current,
               (__normal_iterator<polyscope::SlicePlane_**,_std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>_>
                *)in_stack_ffffffffffffff68);
    in_stack_ffffffffffffff70 =
         std::vector<polyscope::SlicePlane_*,_std::allocator<polyscope::SlicePlane_*>_>::erase
                   (this_00._M_current,in_RDI);
  }
  std::shared_ptr<polyscope::render::ShaderProgram>::~shared_ptr
            ((shared_ptr<polyscope::render::ShaderProgram> *)0x38b6c7);
  TransformationGizmo::~TransformationGizmo
            ((TransformationGizmo *)in_stack_ffffffffffffff70._M_current);
  PersistentValue<float>::~PersistentValue
            ((PersistentValue<float> *)in_stack_ffffffffffffff70._M_current);
  PersistentValue<glm::vec<3,_float,_(glm::qualifier)0>_>::~PersistentValue(this_01);
  PersistentValue<glm::mat<4,_4,_float,_(glm::qualifier)0>_>::~PersistentValue
            (in_stack_fffffffffffffff0);
  PersistentValue<bool>::~PersistentValue
            ((PersistentValue<bool> *)in_stack_ffffffffffffff70._M_current);
  PersistentValue<bool>::~PersistentValue
            ((PersistentValue<bool> *)in_stack_ffffffffffffff70._M_current);
  std::__cxx11::string::~string((string *)((long)in_RDI._M_current + 0x20));
  std::__cxx11::string::~string((string *)in_RDI._M_current);
  return;
}

Assistant:

SlicePlane::~SlicePlane() {
  render::engine->removeSlicePlane(postfix);
  auto pos = std::find(state::slicePlanes.begin(), state::slicePlanes.end(), this);
  if (pos == state::slicePlanes.end()) return;
  state::slicePlanes.erase(pos);
}